

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O3

bool __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
::find_impl<unsigned_long>
          (raw_hash_set<phmap::priv::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
           *this,key_arg<unsigned_long> *key,size_t hashval,size_t *offset)

{
  char *pcVar1;
  ulong uVar2;
  ctrl_t *pcVar3;
  slot_type *psVar4;
  uint uVar5;
  ushort uVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  long lVar23;
  ulong uVar24;
  uint uVar25;
  ulong uVar26;
  __m128i match;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar30 [16];
  char cVar29;
  char cVar31;
  char cVar32;
  char cVar33;
  
  uVar2 = this->capacity_;
  if ((uVar2 + 1 & uVar2) != 0) {
    __assert_fail("((mask + 1) & mask) == 0 && \"not a mask\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/csbuild/deps/include/covscript/import/parallel_hashmap/phmap.h"
                  ,0x96,"phmap::priv::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]");
  }
  uVar24 = hashval >> 7;
  pcVar3 = this->ctrl_;
  psVar4 = this->slots_;
  auVar27 = ZEXT216(CONCAT11((char)hashval,(char)hashval) & 0x7f7f);
  auVar27 = pshuflw(auVar27,auVar27,0);
  lVar23 = 0;
  do {
    uVar24 = uVar24 & uVar2;
    pcVar1 = pcVar3 + uVar24;
    cVar7 = *pcVar1;
    cVar8 = pcVar1[1];
    cVar9 = pcVar1[2];
    cVar10 = pcVar1[3];
    cVar11 = pcVar1[4];
    cVar12 = pcVar1[5];
    cVar13 = pcVar1[6];
    cVar14 = pcVar1[7];
    cVar15 = pcVar1[8];
    cVar16 = pcVar1[9];
    cVar17 = pcVar1[10];
    cVar18 = pcVar1[0xb];
    cVar19 = pcVar1[0xc];
    cVar20 = pcVar1[0xd];
    cVar21 = pcVar1[0xe];
    cVar22 = pcVar1[0xf];
    cVar29 = auVar27[0];
    auVar30[0] = -(cVar29 == cVar7);
    cVar31 = auVar27[1];
    auVar30[1] = -(cVar31 == cVar8);
    cVar32 = auVar27[2];
    auVar30[2] = -(cVar32 == cVar9);
    cVar33 = auVar27[3];
    auVar30[3] = -(cVar33 == cVar10);
    auVar30[4] = -(cVar29 == cVar11);
    auVar30[5] = -(cVar31 == cVar12);
    auVar30[6] = -(cVar32 == cVar13);
    auVar30[7] = -(cVar33 == cVar14);
    auVar30[8] = -(cVar29 == cVar15);
    auVar30[9] = -(cVar31 == cVar16);
    auVar30[10] = -(cVar32 == cVar17);
    auVar30[0xb] = -(cVar33 == cVar18);
    auVar30[0xc] = -(cVar29 == cVar19);
    auVar30[0xd] = -(cVar31 == cVar20);
    auVar30[0xe] = -(cVar32 == cVar21);
    auVar30[0xf] = -(cVar33 == cVar22);
    uVar6 = (ushort)(SUB161(auVar30 >> 7,0) & 1) | (ushort)(SUB161(auVar30 >> 0xf,0) & 1) << 1 |
            (ushort)(SUB161(auVar30 >> 0x17,0) & 1) << 2 |
            (ushort)(SUB161(auVar30 >> 0x1f,0) & 1) << 3 |
            (ushort)(SUB161(auVar30 >> 0x27,0) & 1) << 4 |
            (ushort)(SUB161(auVar30 >> 0x2f,0) & 1) << 5 |
            (ushort)(SUB161(auVar30 >> 0x37,0) & 1) << 6 |
            (ushort)(SUB161(auVar30 >> 0x3f,0) & 1) << 7 |
            (ushort)(SUB161(auVar30 >> 0x47,0) & 1) << 8 |
            (ushort)(SUB161(auVar30 >> 0x4f,0) & 1) << 9 |
            (ushort)(SUB161(auVar30 >> 0x57,0) & 1) << 10 |
            (ushort)(SUB161(auVar30 >> 0x5f,0) & 1) << 0xb |
            (ushort)(SUB161(auVar30 >> 0x67,0) & 1) << 0xc |
            (ushort)(SUB161(auVar30 >> 0x6f,0) & 1) << 0xd |
            (ushort)(SUB161(auVar30 >> 0x77,0) & 1) << 0xe | (ushort)(auVar30[0xf] >> 7) << 0xf;
    if (uVar6 != 0) {
      uVar25 = (uint)uVar6;
      do {
        uVar5 = 0;
        if (uVar25 != 0) {
          for (; (uVar25 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
          }
        }
        uVar26 = uVar5 + uVar24 & uVar2;
        *offset = uVar26;
        if (psVar4[uVar26].value.first == *key) {
          return true;
        }
        uVar25 = uVar25 - 1 & uVar25;
      } while (uVar25 != 0);
    }
    auVar28[0] = -(cVar7 == -0x80);
    auVar28[1] = -(cVar8 == -0x80);
    auVar28[2] = -(cVar9 == -0x80);
    auVar28[3] = -(cVar10 == -0x80);
    auVar28[4] = -(cVar11 == -0x80);
    auVar28[5] = -(cVar12 == -0x80);
    auVar28[6] = -(cVar13 == -0x80);
    auVar28[7] = -(cVar14 == -0x80);
    auVar28[8] = -(cVar15 == -0x80);
    auVar28[9] = -(cVar16 == -0x80);
    auVar28[10] = -(cVar17 == -0x80);
    auVar28[0xb] = -(cVar18 == -0x80);
    auVar28[0xc] = -(cVar19 == -0x80);
    auVar28[0xd] = -(cVar20 == -0x80);
    auVar28[0xe] = -(cVar21 == -0x80);
    auVar28[0xf] = -(cVar22 == -0x80);
    if ((((((((((((((((auVar28 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar28 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar28 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar28 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar28 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar28 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar28 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar28 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar28 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar28 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar28 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar28 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar28 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
         (auVar28 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar28 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || cVar22 == -0x80) {
      return false;
    }
    uVar24 = uVar24 + lVar23 + 0x10;
    lVar23 = lVar23 + 0x10;
  } while( true );
}

Assistant:

bool find_impl(const key_arg<K>& key, size_t hashval, size_t& offset)
			{
				auto seq = probe(hashval);
				while (true) {
					Group g{ ctrl_ + seq.offset() };
					for (uint32_t i : g.Match((h2_t)H2(hashval))) {
						offset = seq.offset((size_t)i);
						if (PHMAP_PREDICT_TRUE(PolicyTraits::apply(
						                           EqualElement<K> {key, eq_ref()},
						                           PolicyTraits::element(slots_ + offset))))
							return true;
					}
					if (PHMAP_PREDICT_TRUE(g.MatchEmpty()))
						return false;
					seq.next();
				}
			}